

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Abc_NtkDfsReverseOne_rec(Abc_Obj_t *pObj,Vec_Int_t *vTfo,int nLevelMax,int nFanoutMax)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  iVar2 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar2 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    uVar3 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((int)(*(uint *)&pObj->field_0x14 >> 0xc) <= nLevelMax && 1 < uVar3 - 3) {
      if (uVar3 != 7) {
        __assert_fail("Abc_ObjIsNode( pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x57b,"void Abc_NtkDfsReverseOne_rec(Abc_Obj_t *, Vec_Int_t *, int, int)");
      }
      uVar3 = (pObj->vFanouts).nSize;
      if ((int)uVar3 <= nFanoutMax) {
        uVar5 = 0;
        uVar4 = 0;
        if (0 < (int)uVar3) {
          uVar4 = (ulong)uVar3;
        }
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          uVar1 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[uVar5]] + 0x14);
          if (((uint)nLevelMax < uVar1 >> 0xc) || ((uVar1 & 0xf) - 3 < 2)) {
            uVar4 = uVar5 & 0xffffffff;
            break;
          }
        }
        if ((uint)uVar4 == uVar3) {
          for (lVar6 = 0; lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
            Abc_NtkDfsReverseOne_rec
                      ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]],vTfo,
                       nLevelMax,nFanoutMax);
            uVar3 = (pObj->vFanouts).nSize;
          }
        }
      }
      Vec_IntPush(vTfo,pObj->Id);
      (pObj->field_6).iTemp = 0;
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsReverseOne_rec( Abc_Obj_t * pObj, Vec_Int_t * vTfo, int nLevelMax, int nFanoutMax )
{
    Abc_Obj_t * pFanout; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCo(pObj) || Abc_ObjLevel(pObj) > nLevelMax )
        return;
    assert( Abc_ObjIsNode( pObj ) );
    if ( Abc_ObjFanoutNum(pObj) <= nFanoutMax )
    {
        Abc_ObjForEachFanout( pObj, pFanout, i )
            if ( Abc_ObjIsCo(pFanout) || Abc_ObjLevel(pFanout) > nLevelMax )
                break;
        if ( i == Abc_ObjFanoutNum(pObj) )
            Abc_ObjForEachFanout( pObj, pFanout, i )
                Abc_NtkDfsReverseOne_rec( pFanout, vTfo, nLevelMax, nFanoutMax );
    }
    Vec_IntPush( vTfo, Abc_ObjId(pObj) );
    pObj->iTemp = 0;
}